

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::getRenderTargetSize
          (GeometryShaderRenderingTrianglesCase *this,uint n_instances,uint *out_width,
          uint *out_height)

{
  TestError *this_00;
  
  if (*(uint *)&(this->super_GeometryShaderRenderingCase).field_0x304 < 3) {
    *out_width = 0x1d;
    *out_height = n_instances * 0x1d;
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unsupported output type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0x12af);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingTrianglesCase::getRenderTargetSize(unsigned int n_instances, unsigned int* out_width,
															   unsigned int* out_height)
{
	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	case SHADER_OUTPUT_TYPE_POINTS:
	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		*out_width  = 29;				/* as per test spec */
		*out_height = 29 * n_instances; /* as per test spec */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported output type");
	}
	}
}